

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonEachBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  int iVar1;
  uint uVar2;
  int iMask;
  int iCol;
  sqlite3_index_constraint *pConstraint;
  uint local_30;
  int idxMask;
  int unusableMask;
  int aIdx [2];
  int i;
  sqlite3_index_info *pIdxInfo_local;
  sqlite3_vtab *tab_local;
  
  local_30 = 0;
  pConstraint._4_4_ = 0;
  unusableMask = -1;
  idxMask = -1;
  _iMask = pIdxInfo->aConstraint;
  unique0x1000011a = pIdxInfo;
  for (aIdx[0] = 0; aIdx[0] < stack0xffffffffffffffe0->nConstraint; aIdx[0] = aIdx[0] + 1) {
    if (7 < _iMask->iColumn) {
      iVar1 = _iMask->iColumn + -8;
      uVar2 = 1 << ((byte)iVar1 & 0x1f);
      if (_iMask->usable == '\0') {
        local_30 = uVar2 | local_30;
      }
      else if (_iMask->op == '\x02') {
        (&idxMask)[iVar1] = aIdx[0];
        pConstraint._4_4_ = uVar2 | pConstraint._4_4_;
      }
    }
    _iMask = _iMask + 1;
  }
  if ((local_30 & (pConstraint._4_4_ ^ 0xffffffff)) == 0) {
    if (idxMask < 0) {
      stack0xffffffffffffffe0->idxNum = 0;
    }
    else {
      stack0xffffffffffffffe0->estimatedCost = 1.0;
      stack0xffffffffffffffe0->aConstraintUsage[idxMask].argvIndex = 1;
      stack0xffffffffffffffe0->aConstraintUsage[idxMask].omit = '\x01';
      if (unusableMask < 0) {
        stack0xffffffffffffffe0->idxNum = 1;
      }
      else {
        stack0xffffffffffffffe0->aConstraintUsage[unusableMask].argvIndex = 2;
        stack0xffffffffffffffe0->aConstraintUsage[unusableMask].omit = '\x01';
        stack0xffffffffffffffe0->idxNum = 3;
      }
    }
    tab_local._4_4_ = 0;
  }
  else {
    tab_local._4_4_ = 0x13;
  }
  return tab_local._4_4_;
}

Assistant:

static int jsonEachBestIndex(
  sqlite3_vtab *tab,
  sqlite3_index_info *pIdxInfo
){
  int i;                     /* Loop counter or computed array index */
  int aIdx[2];               /* Index of constraints for JSON and ROOT */
  int unusableMask = 0;      /* Mask of unusable JSON and ROOT constraints */
  int idxMask = 0;           /* Mask of usable == constraints JSON and ROOT */
  const struct sqlite3_index_constraint *pConstraint;

  /* This implementation assumes that JSON and ROOT are the last two
  ** columns in the table */
  assert( JEACH_ROOT == JEACH_JSON+1 );
  UNUSED_PARAM(tab);
  aIdx[0] = aIdx[1] = -1;
  pConstraint = pIdxInfo->aConstraint;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    int iCol;
    int iMask;
    if( pConstraint->iColumn < JEACH_JSON ) continue;
    iCol = pConstraint->iColumn - JEACH_JSON;
    assert( iCol==0 || iCol==1 );
    iMask = 1 << iCol;
    if( pConstraint->usable==0 ){
      unusableMask |= iMask;
    }else if( pConstraint->op==SQLITE_INDEX_CONSTRAINT_EQ ){
      aIdx[iCol] = i;
      idxMask |= iMask;
    }
  }
  if( (unusableMask & ~idxMask)!=0 ){
    /* If there are any unusable constraints on JSON or ROOT, then reject
    ** this entire plan */
    return SQLITE_CONSTRAINT;
  }
  if( aIdx[0]<0 ){
    /* No JSON input.  Leave estimatedCost at the huge value that it was
    ** initialized to to discourage the query planner from selecting this
    ** plan. */
    pIdxInfo->idxNum = 0;
  }else{
    pIdxInfo->estimatedCost = 1.0;
    i = aIdx[0];
    pIdxInfo->aConstraintUsage[i].argvIndex = 1;
    pIdxInfo->aConstraintUsage[i].omit = 1;
    if( aIdx[1]<0 ){
      pIdxInfo->idxNum = 1;  /* Only JSON supplied.  Plan 1 */
    }else{
      i = aIdx[1];
      pIdxInfo->aConstraintUsage[i].argvIndex = 2;
      pIdxInfo->aConstraintUsage[i].omit = 1;
      pIdxInfo->idxNum = 3;  /* Both JSON and ROOT are supplied.  Plan 3 */
    }
  }
  return SQLITE_OK;
}